

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O2

REF_STATUS
ref_gather_cell(REF_NODE ref_node,REF_CELL ref_cell,REF_BOOL faceid_insted_of_c2n,REF_BOOL always_id
               ,REF_BOOL swap_endian,REF_BOOL sixty_four_bit,REF_BOOL select_faceid,REF_INT faceid,
               REF_BOOL pad,FILE *file)

{
  int iVar1;
  REF_BOOL RVar2;
  REF_STATUS RVar3;
  uint uVar4;
  size_t sVar5;
  void *pvVar6;
  ulong uVar7;
  ulong uVar8;
  undefined8 uVar9;
  REF_MPI ref_mpi;
  ulong uVar10;
  long lVar11;
  int iVar12;
  char *pcVar13;
  long lVar14;
  undefined4 in_stack_00000014;
  REF_INT ncell;
  uint local_1ec;
  void *local_1e8;
  ulong local_1e0;
  ulong local_1d8;
  REF_INT part;
  long local_1c8;
  REF_BOOL local_1c0;
  REF_BOOL local_1bc;
  REF_MPI local_1b8;
  int local_1ac;
  REF_BOOL local_1a8;
  undefined4 local_1a4;
  void *local_1a0;
  long local_198;
  void *local_190;
  ulong auStack_188 [4];
  undefined8 uStack_168;
  REF_INT nodes [27];
  
  local_1e8 = (void *)CONCAT44(local_1e8._4_4_,swap_endian);
  ref_mpi = ref_node->ref_mpi;
  uVar4 = ref_cell->node_per;
  local_1e0 = (ulong)(int)uVar4;
  local_1c8 = (long)ref_cell->size_per;
  local_1c0 = always_id;
  local_1b8 = ref_mpi;
  local_1a8 = faceid_insted_of_c2n;
  if (ref_mpi->id == 0) {
    iVar12 = 0;
    uVar10 = 0;
    local_1bc = sixty_four_bit;
    if (0 < (int)uVar4) {
      uVar10 = (ulong)uVar4;
    }
    for (; iVar12 < ref_cell->max; iVar12 = iVar12 + 1) {
      RVar3 = ref_cell_nodes(ref_cell,iVar12,nodes);
      if (RVar3 == 0) {
        uVar4 = ref_cell_part(ref_cell,ref_node,iVar12,&part);
        RVar2 = local_1bc;
        if (uVar4 != 0) {
          uVar10 = (ulong)uVar4;
          pcVar13 = "part";
          uVar9 = 0x79a;
          goto LAB_001378c6;
        }
        if (ref_mpi->id == part) {
          for (uVar8 = 0; uVar10 != uVar8; uVar8 = uVar8 + 1) {
            iVar1 = nodes[uVar8];
            if (((long)iVar1 < 0) || (ref_node->max <= iVar1)) {
              uVar7 = 0;
            }
            else {
              uVar7 = 0;
              if (-1 < ref_node->global[iVar1]) {
                uVar7 = ref_node->global[iVar1] + 1;
              }
            }
            auStack_188[uVar8] = uVar7;
          }
          auStack_188[local_1e0] = 0;
          if ((int)local_1e0 < (int)local_1c8) {
            auStack_188[local_1e0] = (long)nodes[local_1e0];
          }
          uVar7 = auStack_188[2];
          uVar8 = auStack_188[1];
          if ((local_1c0 != 0) && (ref_cell->type == REF_CELL_PYR)) {
            auStack_188[1] = auStack_188[3];
            auStack_188[2] = uStack_168;
            auStack_188[3] = uVar8;
            uStack_168 = uVar7;
          }
          if (local_1a8 == 0) {
            for (uVar8 = 0; ref_mpi = local_1b8, uVar10 != uVar8; uVar8 = uVar8 + 1) {
              uVar7 = auStack_188[uVar8];
              if (RVar2 == 0) {
                uVar4 = (uint)uVar7;
                local_1ec = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                            uVar4 << 0x18;
                if ((int)local_1e8 == 0) {
                  local_1ec = uVar4;
                }
                sVar5 = fwrite(&local_1ec,4,1,(FILE *)CONCAT44(in_stack_00000014,faceid));
                if (sVar5 != 1) {
                  pcVar13 = "int cel node";
                  uVar9 = 0x7c7;
                  goto LAB_00137b36;
                }
              }
              else {
                local_1d8 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                            (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                            (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
                            (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
                if ((int)local_1e8 == 0) {
                  local_1d8 = uVar7;
                }
                sVar5 = fwrite(&local_1d8,8,1,(FILE *)CONCAT44(in_stack_00000014,faceid));
                if (sVar5 != 1) {
                  pcVar13 = "long cel node";
                  uVar9 = 0x7c2;
                  goto LAB_00137b36;
                }
              }
            }
            if (select_faceid != 0) {
              ncell = 0;
              sVar5 = fwrite(&ncell,4,1,(FILE *)CONCAT44(in_stack_00000014,faceid));
              if (sVar5 != 1) {
                pcVar13 = "zero pad";
                uVar9 = 0x7cd;
LAB_00137b36:
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,uVar9,"ref_gather_cell",pcVar13,1,sVar5);
                return 1;
              }
            }
            if (local_1c0 != 0) {
              uVar8 = auStack_188[local_1e0];
              if (RVar2 == 0) {
                uVar4 = (uint)uVar8;
                local_1ec = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                            uVar4 << 0x18;
                if ((int)local_1e8 == 0) {
                  local_1ec = uVar4;
                }
                sVar5 = fwrite(&local_1ec,4,1,(FILE *)CONCAT44(in_stack_00000014,faceid));
                if (sVar5 != 1) {
                  pcVar13 = "int id";
                  uVar9 = 0x7d8;
                  goto LAB_00137b36;
                }
              }
              else {
                local_1d8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                            (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                            (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                            (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
                if ((int)local_1e8 == 0) {
                  local_1d8 = uVar8;
                }
                sVar5 = fwrite(&local_1d8,8,1,(FILE *)CONCAT44(in_stack_00000014,faceid));
                if (sVar5 != 1) {
                  pcVar13 = "long id";
                  uVar9 = 0x7d4;
                  goto LAB_00137b36;
                }
              }
            }
          }
          else {
            uVar8 = auStack_188[local_1e0];
            if (local_1bc == 0) {
              uVar4 = (uint)uVar8;
              local_1ec = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                          uVar4 << 0x18;
              if ((int)local_1e8 == 0) {
                local_1ec = uVar4;
              }
              sVar5 = fwrite(&local_1ec,4,1,(FILE *)CONCAT44(in_stack_00000014,faceid));
              if (sVar5 != 1) {
                pcVar13 = "int id";
                uVar9 = 0x7ba;
                goto LAB_00137b36;
              }
            }
            else {
              local_1d8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                          (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                          (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                          (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
              if ((int)local_1e8 == 0) {
                local_1d8 = uVar8;
              }
              sVar5 = fwrite(&local_1d8,8,1,(FILE *)CONCAT44(in_stack_00000014,faceid));
              if (sVar5 != 1) {
                pcVar13 = "long id";
                uVar9 = 0x7b6;
                goto LAB_00137b36;
              }
            }
          }
        }
      }
    }
    if (ref_mpi->id == 0) {
      lVar14 = local_1c8 * 8;
      RVar3 = 2;
      local_1ac = 1;
      do {
        if (ref_mpi->n <= local_1ac) {
          return 0;
        }
        uVar4 = ref_mpi_gather_recv(ref_mpi,&ncell,1,1,local_1ac);
        if (uVar4 != 0) {
          pcVar13 = "recv ncell";
          uVar9 = 0x7e3;
          goto LAB_00136fbe;
        }
        if (0 < ncell) {
          uVar4 = ncell * (int)local_1c8;
          if ((int)uVar4 < 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x7e5,"ref_gather_cell","malloc c2n of REF_GLOB negative");
            return 1;
          }
          pvVar6 = malloc((ulong)uVar4 << 3);
          if (pvVar6 == (void *)0x0) {
            pcVar13 = "malloc c2n of REF_GLOB NULL";
            uVar9 = 0x7e5;
            goto LAB_001377ac;
          }
          uVar4 = ref_mpi_gather_recv(local_1b8,pvVar6,uVar4,2,local_1ac);
          if (uVar4 != 0) {
            pcVar13 = "recv c2n";
            uVar9 = 0x7e8;
            goto LAB_00136fbe;
          }
          local_190 = (void *)(local_1e0 * 8 + (long)pvVar6);
          local_1a0 = pvVar6;
          local_198 = lVar14;
          for (lVar11 = 0; lVar11 < ncell; lVar11 = lVar11 + 1) {
            for (uVar8 = 0; uVar10 != uVar8; uVar8 = uVar8 + 1) {
              auStack_188[uVar8] = *(long *)((long)pvVar6 + uVar8 * 8) + 1;
            }
            auStack_188[local_1e0] = 0;
            if ((int)local_1e0 < (int)local_1c8) {
              auStack_188[local_1e0] = *(ulong *)((long)local_190 + lVar11 * local_1c8 * 8);
            }
            uVar7 = auStack_188[2];
            uVar8 = auStack_188[1];
            if ((local_1c0 != 0) && (ref_cell->type == REF_CELL_PYR)) {
              auStack_188[1] = auStack_188[3];
              auStack_188[2] = uStack_168;
              auStack_188[3] = uVar8;
              uStack_168 = uVar7;
            }
            if (local_1a8 == 0) {
              for (uVar8 = 0; lVar14 = local_198, uVar10 != uVar8; uVar8 = uVar8 + 1) {
                uVar7 = auStack_188[uVar8];
                if (local_1bc == 0) {
                  uVar4 = (uint)uVar7;
                  local_1ec = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                              uVar4 << 0x18;
                  if ((int)local_1e8 == 0) {
                    local_1ec = uVar4;
                  }
                  sVar5 = fwrite(&local_1ec,4,1,(FILE *)CONCAT44(in_stack_00000014,faceid));
                  if (sVar5 != 1) {
                    pcVar13 = "int cel node";
                    uVar9 = 0x816;
                    goto LAB_00137b36;
                  }
                }
                else {
                  local_1d8 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                              (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                              (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
                              (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
                  if ((int)local_1e8 == 0) {
                    local_1d8 = uVar7;
                  }
                  sVar5 = fwrite(&local_1d8,8,1,(FILE *)CONCAT44(in_stack_00000014,faceid));
                  if (sVar5 != 1) {
                    pcVar13 = "long cel node";
                    uVar9 = 0x811;
                    goto LAB_00137b36;
                  }
                }
              }
              if (select_faceid != 0) {
                local_1a4 = 0;
                sVar5 = fwrite(&local_1a4,4,1,(FILE *)CONCAT44(in_stack_00000014,faceid));
                if (sVar5 != 1) {
                  pcVar13 = "zero pad";
                  uVar9 = 0x81c;
                  goto LAB_00137b36;
                }
              }
              if (local_1c0 != 0) {
                uVar8 = auStack_188[local_1e0];
                if (local_1bc == 0) {
                  uVar4 = (uint)uVar8;
                  local_1ec = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                              uVar4 << 0x18;
                  if ((int)local_1e8 == 0) {
                    local_1ec = uVar4;
                  }
                  sVar5 = fwrite(&local_1ec,4,1,(FILE *)CONCAT44(in_stack_00000014,faceid));
                  if (sVar5 != 1) {
                    pcVar13 = "int id";
                    uVar9 = 0x827;
                    goto LAB_00137b36;
                  }
                }
                else {
                  local_1d8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                              (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                              (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                              (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
                  if ((int)local_1e8 == 0) {
                    local_1d8 = uVar8;
                  }
                  sVar5 = fwrite(&local_1d8,8,1,(FILE *)CONCAT44(in_stack_00000014,faceid));
                  if (sVar5 != 1) {
                    pcVar13 = "long id";
                    uVar9 = 0x823;
                    goto LAB_00137b36;
                  }
                }
              }
            }
            else {
              uVar8 = auStack_188[local_1e0];
              if (local_1bc == 0) {
                uVar4 = (uint)uVar8;
                local_1ec = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                            uVar4 << 0x18;
                if ((int)local_1e8 == 0) {
                  local_1ec = uVar4;
                }
                sVar5 = fwrite(&local_1ec,4,1,(FILE *)CONCAT44(in_stack_00000014,faceid));
                if (sVar5 != 1) {
                  pcVar13 = "int id";
                  uVar9 = 0x809;
                  goto LAB_00137b36;
                }
              }
              else {
                local_1d8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                            (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                            (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                            (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38;
                if ((int)local_1e8 == 0) {
                  local_1d8 = uVar8;
                }
                sVar5 = fwrite(&local_1d8,8,1,(FILE *)CONCAT44(in_stack_00000014,faceid));
                if (sVar5 != 1) {
                  pcVar13 = "long id";
                  uVar9 = 0x805;
                  goto LAB_00137b36;
                }
              }
            }
            pvVar6 = (void *)((long)pvVar6 + lVar14);
          }
          free(local_1a0);
        }
        local_1ac = local_1ac + 1;
        ref_mpi = local_1b8;
      } while( true );
    }
  }
  ncell = 0;
  for (iVar12 = 0; iVar12 < ref_cell->max; iVar12 = iVar12 + 1) {
    RVar3 = ref_cell_nodes(ref_cell,iVar12,nodes);
    if (RVar3 == 0) {
      uVar4 = ref_cell_part(ref_cell,ref_node,iVar12,&part);
      if (uVar4 != 0) {
        uVar10 = (ulong)uVar4;
        pcVar13 = "part";
        uVar9 = 0x832;
        goto LAB_001378c6;
      }
      if (local_1b8->id == part) {
        ncell = ncell + 1;
      }
    }
  }
  RVar3 = 1;
  uVar4 = ref_mpi_gather_send(local_1b8,&ncell,1,1);
  if (uVar4 != 0) {
    pcVar13 = "send ncell";
    uVar9 = 0x837;
LAB_00136fbe:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar9,
           "ref_gather_cell",(ulong)uVar4,pcVar13);
    return uVar4;
  }
  if (0 < ncell) {
    if (ncell * (int)local_1c8 < 0) {
      pcVar13 = "malloc c2n of REF_GLOB negative";
      uVar9 = 0x839;
LAB_001377ac:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             uVar9,"ref_gather_cell",pcVar13);
      return RVar3;
    }
    pvVar6 = malloc((ulong)(uint)(ncell * (int)local_1c8) << 3);
    if (pvVar6 == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x839,"ref_gather_cell","malloc c2n of REF_GLOB NULL");
      return 2;
    }
    ncell = 0;
    iVar12 = 0;
    uVar10 = 0;
    if (0 < (int)local_1e0) {
      uVar10 = local_1e0 & 0xffffffff;
    }
    lVar14 = -1;
    local_1e8 = pvVar6;
    for (; pvVar6 = local_1e8, iVar12 < ref_cell->max; iVar12 = iVar12 + 1) {
      RVar3 = ref_cell_nodes(ref_cell,iVar12,nodes);
      if (RVar3 == 0) {
        uVar4 = ref_cell_part(ref_cell,ref_node,iVar12,&part);
        if (uVar4 != 0) {
          uVar10 = (ulong)uVar4;
          pcVar13 = "part";
          uVar9 = 0x83c;
          goto LAB_001378c6;
        }
        if (local_1b8->id == part) {
          for (uVar8 = 0; uVar7 = local_1e0, uVar10 != uVar8; uVar8 = uVar8 + 1) {
            iVar1 = nodes[uVar8];
            lVar11 = lVar14;
            if (((-1 < (long)iVar1) && (iVar1 < ref_node->max)) &&
               (lVar11 = ref_node->global[iVar1], ref_node->global[iVar1] < 0)) {
              lVar11 = lVar14;
            }
            *(long *)((long)local_1e8 + uVar8 * 8 + (long)(ncell * (int)local_1c8) * 8) = lVar11;
          }
          for (; (long)uVar7 < local_1c8; uVar7 = uVar7 + 1) {
            *(long *)((long)local_1e8 + uVar7 * 8 + (long)(ncell * (int)local_1c8) * 8) =
                 (long)nodes[uVar7];
          }
          ncell = ncell + 1;
        }
      }
    }
    uVar4 = ref_mpi_gather_send(local_1b8,local_1e8,ncell * (int)local_1c8,2);
    if (uVar4 != 0) {
      uVar10 = (ulong)uVar4;
      pcVar13 = "send c2n";
      uVar9 = 0x848;
LAB_001378c6:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             uVar9,"ref_gather_cell",uVar10,pcVar13);
      return (REF_STATUS)uVar10;
    }
    free(pvVar6);
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_cell(
    REF_NODE ref_node, REF_CELL ref_cell, REF_BOOL faceid_insted_of_c2n,
    REF_BOOL always_id, REF_BOOL swap_endian, REF_BOOL sixty_four_bit,
    REF_BOOL select_faceid, REF_INT faceid, REF_BOOL pad, FILE *file) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT cell, node, part;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_LONG globals[REF_CELL_MAX_SIZE_PER + 1];
  REF_INT node_per = ref_cell_node_per(ref_cell);
  REF_INT size_per = ref_cell_size_per(ref_cell);
  REF_INT ncell;
  REF_GLOB *c2n;
  REF_INT c2n_int;
  REF_LONG c2n_long;
  REF_INT proc;

  if (ref_mpi_once(ref_mpi)) {
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
      if (ref_mpi_rank(ref_mpi) == part &&
          (!select_faceid || nodes[ref_cell_node_per(ref_cell)] == faceid)) {
        for (node = 0; node < node_per; node++)
          globals[node] = ref_node_global(ref_node, nodes[node]) + 1;
        globals[node_per] = REF_EXPORT_MESHB_3D_ID;
        if (size_per > node_per) globals[node_per] = nodes[node_per];

        if (always_id && REF_CELL_PYR == ref_cell_type(ref_cell)) {
          REF_LONG n0, n1, n2, n3, n4;
          /* convention: square basis is 0-1-2-3
             (oriented counter clockwise like trias) and top vertex is 4 */
          n0 = globals[0];
          n1 = globals[3];
          n2 = globals[4];
          n3 = globals[1];
          n4 = globals[2];
          globals[0] = n0;
          globals[1] = n1;
          globals[2] = n2;
          globals[3] = n3;
          globals[4] = n4;
        }

        if (faceid_insted_of_c2n) {
          if (sixty_four_bit) {
            c2n_long = globals[node_per];
            if (swap_endian) SWAP_LONG(c2n_long);
            REIS(1, fwrite(&(c2n_long), sizeof(REF_LONG), 1, file), "long id");
          } else {
            c2n_int = (REF_INT)globals[node_per];
            if (swap_endian) SWAP_INT(c2n_int);
            REIS(1, fwrite(&(c2n_int), sizeof(REF_INT), 1, file), "int id");
          }
        } else {
          for (node = 0; node < node_per; node++) {
            if (sixty_four_bit) {
              c2n_long = globals[node];
              if (swap_endian) SWAP_LONG(c2n_long);
              REIS(1, fwrite(&c2n_long, sizeof(REF_LONG), 1, file),
                   "long cel node");
            } else {
              c2n_int = (REF_INT)globals[node];
              if (swap_endian) SWAP_INT(c2n_int);
              REIS(1, fwrite(&c2n_int, sizeof(REF_INT), 1, file),
                   "int cel node");
            }
          }
          if (pad) {
            REF_INT zero = 0;
            if (swap_endian) SWAP_INT(zero);
            REIS(1, fwrite(&(zero), sizeof(REF_INT), 1, file), "zero pad");
          }
          if (always_id) {
            if (sixty_four_bit) {
              c2n_long = globals[node_per];
              if (swap_endian) SWAP_LONG(c2n_long);
              REIS(1, fwrite(&(c2n_long), sizeof(REF_LONG), 1, file),
                   "long id");
            } else {
              c2n_int = (REF_INT)globals[node_per];
              if (swap_endian) SWAP_INT(c2n_int);
              REIS(1, fwrite(&(c2n_int), sizeof(REF_INT), 1, file), "int id");
            }
          }
        }
      }
    }
  }

  if (ref_mpi_once(ref_mpi)) {
    each_ref_mpi_worker(ref_mpi, proc) {
      RSS(ref_mpi_gather_recv(ref_mpi, &ncell, 1, REF_INT_TYPE, proc),
          "recv ncell");
      if (ncell > 0) {
        ref_malloc(c2n, ncell * size_per, REF_GLOB);
        RSS(ref_mpi_gather_recv(ref_mpi, c2n, ncell * size_per, REF_GLOB_TYPE,
                                proc),
            "recv c2n");
        for (cell = 0; cell < ncell; cell++) {
          for (node = 0; node < node_per; node++)
            globals[node] = c2n[node + size_per * cell] + 1;
          globals[node_per] = REF_EXPORT_MESHB_3D_ID;
          if (size_per > node_per)
            globals[node_per] = c2n[node_per + size_per * cell];

          if (always_id && REF_CELL_PYR == ref_cell_type(ref_cell)) {
            REF_LONG n0, n1, n2, n3, n4;
            /* convention: square basis is 0-1-2-3
               (oriented counter clockwise like trias) and top vertex is 4 */
            n0 = globals[0];
            n1 = globals[3];
            n2 = globals[4];
            n3 = globals[1];
            n4 = globals[2];
            globals[0] = n0;
            globals[1] = n1;
            globals[2] = n2;
            globals[3] = n3;
            globals[4] = n4;
          }

          if (faceid_insted_of_c2n) {
            if (sixty_four_bit) {
              c2n_long = globals[node_per];
              if (swap_endian) SWAP_LONG(c2n_long);
              REIS(1, fwrite(&(c2n_long), sizeof(REF_LONG), 1, file),
                   "long id");
            } else {
              c2n_int = (REF_INT)globals[node_per];
              if (swap_endian) SWAP_INT(c2n_int);
              REIS(1, fwrite(&(c2n_int), sizeof(REF_INT), 1, file), "int id");
            }
          } else {
            for (node = 0; node < node_per; node++) {
              if (sixty_four_bit) {
                c2n_long = globals[node];
                if (swap_endian) SWAP_LONG(c2n_long);
                REIS(1, fwrite(&c2n_long, sizeof(REF_LONG), 1, file),
                     "long cel node");
              } else {
                c2n_int = (REF_INT)globals[node];
                if (swap_endian) SWAP_INT(c2n_int);
                REIS(1, fwrite(&c2n_int, sizeof(REF_INT), 1, file),
                     "int cel node");
              }
            }
            if (pad) {
              REF_INT zero = 0;
              if (swap_endian) SWAP_INT(zero);
              REIS(1, fwrite(&(zero), sizeof(REF_INT), 1, file), "zero pad");
            }
            if (always_id) {
              if (sixty_four_bit) {
                c2n_long = globals[node_per];
                if (swap_endian) SWAP_LONG(c2n_long);
                REIS(1, fwrite(&(c2n_long), sizeof(REF_LONG), 1, file),
                     "long id");
              } else {
                c2n_int = (REF_INT)globals[node_per];
                if (swap_endian) SWAP_INT(c2n_int);
                REIS(1, fwrite(&(c2n_int), sizeof(REF_INT), 1, file), "int id");
              }
            }
          }
        }
        ref_free(c2n);
      }
    }
  } else {
    ncell = 0;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
      if (ref_mpi_rank(ref_mpi) == part &&
          (!select_faceid || nodes[ref_cell_node_per(ref_cell)] == faceid))
        ncell++;
    }
    RSS(ref_mpi_gather_send(ref_mpi, &ncell, 1, REF_INT_TYPE), "send ncell");
    if (ncell > 0) {
      ref_malloc(c2n, ncell * size_per, REF_GLOB);
      ncell = 0;
      each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
        RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
        if (ref_mpi_rank(ref_mpi) == part &&
            (!select_faceid || nodes[ref_cell_node_per(ref_cell)] == faceid)) {
          for (node = 0; node < node_per; node++)
            c2n[node + size_per * ncell] =
                ref_node_global(ref_node, nodes[node]);
          for (node = node_per; node < size_per; node++)
            c2n[node + size_per * ncell] = (REF_GLOB)nodes[node];
          ncell++;
        }
      }
      RSS(ref_mpi_gather_send(ref_mpi, c2n, ncell * size_per, REF_GLOB_TYPE),
          "send c2n");
      ref_free(c2n);
    }
  }

  return REF_SUCCESS;
}